

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O1

void __thiscall ipx::LpSolver::MakeIPMStartingPointValid(LpSolver *this)

{
  Int *pIVar1;
  double dVar2;
  uint uVar3;
  double *pdVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  iVar5 = (this->model_).num_cols_;
  pIVar1 = &(this->model_).num_rows_;
  uVar3 = iVar5 + *pIVar1;
  if (uVar3 == 0 || SCARRY4(iVar5,*pIVar1) != (int)uVar3 < 0) {
    iVar5 = 0;
    dVar8 = 0.0;
  }
  else {
    uVar6 = 0;
    iVar5 = 0;
    dVar8 = 0.0;
    do {
      dVar7 = (this->xl_start_)._M_data[uVar6];
      if ((0.0 < dVar7) && (dVar2 = (this->zl_start_)._M_data[uVar6], 0.0 < dVar2)) {
        dVar8 = dVar8 + dVar7 * dVar2;
        iVar5 = iVar5 + 1;
      }
      dVar7 = (this->xu_start_)._M_data[uVar6];
      if ((0.0 < dVar7) && (dVar2 = (this->zu_start_)._M_data[uVar6], 0.0 < dVar2)) {
        dVar8 = dVar8 + dVar7 * dVar2;
        iVar5 = iVar5 + 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  if (iVar5 == 0) {
    dVar8 = 1.0;
  }
  else {
    dVar8 = dVar8 / (double)iVar5;
  }
  if (0 < (int)uVar3) {
    uVar6 = 0;
    do {
      if ((ulong)ABS((this->model_).lb_._M_data[uVar6]) < 0x7ff0000000000000) {
        pdVar4 = (this->xl_start_)._M_data;
        dVar7 = pdVar4[uVar6];
        if ((dVar7 != 0.0) || (NAN(dVar7))) {
LAB_003a8359:
          pdVar4 = (this->zl_start_)._M_data;
          dVar2 = pdVar4[uVar6];
          if ((dVar2 == 0.0) && (!NAN(dVar2))) {
            pdVar4[uVar6] = dVar8 / dVar7;
          }
        }
        else {
          dVar2 = (this->zl_start_)._M_data[uVar6];
          if ((dVar2 != 0.0) || (NAN(dVar2))) {
            if ((dVar7 != 0.0) || (NAN(dVar7))) goto LAB_003a8359;
            dVar7 = dVar8 / (this->zl_start_)._M_data[uVar6];
          }
          else {
            dVar7 = SQRT(dVar8);
            if (dVar8 < 0.0) {
              dVar7 = sqrt(dVar8);
            }
            (this->zl_start_)._M_data[uVar6] = dVar7;
            pdVar4 = (this->xl_start_)._M_data;
          }
          pdVar4[uVar6] = dVar7;
        }
      }
      if ((ulong)ABS((this->model_).ub_._M_data[uVar6]) < 0x7ff0000000000000) {
        pdVar4 = (this->xu_start_)._M_data;
        dVar7 = pdVar4[uVar6];
        if ((dVar7 != 0.0) || (NAN(dVar7))) {
LAB_003a8416:
          pdVar4 = (this->zu_start_)._M_data;
          dVar2 = pdVar4[uVar6];
          if ((dVar2 == 0.0) && (!NAN(dVar2))) {
            pdVar4[uVar6] = dVar8 / dVar7;
          }
        }
        else {
          dVar2 = (this->zu_start_)._M_data[uVar6];
          if ((dVar2 != 0.0) || (NAN(dVar2))) {
            if ((dVar7 != 0.0) || (NAN(dVar7))) goto LAB_003a8416;
            dVar7 = dVar8 / (this->zu_start_)._M_data[uVar6];
          }
          else {
            dVar7 = SQRT(dVar8);
            if (dVar8 < 0.0) {
              dVar7 = sqrt(dVar8);
            }
            (this->zu_start_)._M_data[uVar6] = dVar7;
            pdVar4 = (this->xu_start_)._M_data;
          }
          pdVar4[uVar6] = dVar7;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  return;
}

Assistant:

void LpSolver::MakeIPMStartingPointValid() {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    Vector& xl = xl_start_;
    Vector& xu = xu_start_;
    Vector& zl = zl_start_;
    Vector& zu = zu_start_;

    Int numComplementarityProducts = 0;
    double sumComplementarityProducts = 0.0;
    for (Int j = 0; j < n+m; ++j) {
        if (xl[j] > 0.0 && zl[j] > 0.0) {
            sumComplementarityProducts += xl[j] * zl[j];
            numComplementarityProducts++;
        }
        if (xu[j] > 0.0 && zu[j] > 0.0) {
            sumComplementarityProducts += xu[j] * zu[j];
            numComplementarityProducts++;
        }
    }
    const double mu = numComplementarityProducts ?
        sumComplementarityProducts / numComplementarityProducts : 1.0;

    for (Int j = 0; j < n+m; ++j) {
        if (std::isfinite(lb[j])) {
            assert(std::isfinite(xl[j]) && xl[j] >= 0.0);
            assert(std::isfinite(zl[j]) && zl[j] >= 0.0);
            if (xl[j] == 0.0 && zl[j] == 0.0)
                xl[j] = zl[j] = std::sqrt(mu);
            else if (xl[j] == 0.0)
                xl[j] = mu / zl[j];
            else if (zl[j] == 0.0)
                zl[j] = mu / xl[j];
        } else {
            assert(xl[j] == INFINITY);
            assert(zl[j] == 0.0);
        }
        if (std::isfinite(ub[j])) {
            assert(std::isfinite(xu[j]) && xu[j] >= 0.0);
            assert(std::isfinite(zu[j]) && zu[j] >= 0.0);
            if (xu[j] == 0.0 && zu[j] == 0.0)
                xu[j] = zu[j] = std::sqrt(mu);
            else if (xu[j] == 0.0)
                xu[j] = mu / zu[j];
            else if (zu[j] == 0.0)
                zu[j] = mu / xu[j];
        } else {
            assert(xu[j] == INFINITY);
            assert(zu[j] == 0.0);
        }
    }
}